

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O1

unsigned_short __thiscall
Assimp::StreamReader<true,_true>::Get<unsigned_short>(StreamReader<true,_true> *this)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  puVar1 = (ushort *)((long)this->current + 2);
  if (puVar1 <= this->limit) {
    uVar2 = *(ushort *)this->current;
    uVar3 = uVar2 >> 8;
    if (this->le == false) {
      uVar3 = uVar2;
      uVar2 = uVar2 >> 8;
    }
    this->current = (int8_t *)puVar1;
    return uVar2 & 0xff | uVar3 << 8;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"End of file or stream limit was reached","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_007fa260;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T Get() {
        if ( current + sizeof(T) > limit) {
            throw DeadlyImportError("End of file or stream limit was reached");
        }

        T f;
        ::memcpy (&f, current, sizeof(T));
        Intern::Getter<SwapEndianess,T,RuntimeSwitch>() (&f,le);
        current += sizeof(T);

        return f;
    }